

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_tile.c
# Opt level: O0

uint32_t TIFFNumberOfTiles(TIFF *tif)

{
  uint32_t first;
  uint32_t local_54;
  uint32_t local_4c;
  uint32_t local_44;
  uint32_t local_2c;
  uint32_t local_28;
  uint local_24;
  uint32_t ntiles;
  uint32_t dz;
  uint32_t dy;
  uint32_t dx;
  TIFFDirectory *td;
  TIFF *tif_local;
  
  dz = (tif->tif_dir).td_tilewidth;
  ntiles = (tif->tif_dir).td_tilelength;
  local_24 = (tif->tif_dir).td_tiledepth;
  if (dz == 0xffffffff) {
    dz = (tif->tif_dir).td_imagewidth;
  }
  if (ntiles == 0xffffffff) {
    ntiles = (tif->tif_dir).td_imagelength;
  }
  if (local_24 == 0xffffffff) {
    local_24 = (tif->tif_dir).td_imagedepth;
  }
  if (((dz == 0) || (ntiles == 0)) || (local_24 == 0)) {
    local_2c = 0;
  }
  else {
    if ((tif->tif_dir).td_imagewidth < -(dz - 1) - 1) {
      local_44 = ((tif->tif_dir).td_imagewidth + (dz - 1)) / dz;
    }
    else {
      local_44 = 0;
    }
    if ((tif->tif_dir).td_imagelength < -(ntiles - 1) - 1) {
      local_4c = ((tif->tif_dir).td_imagelength + (ntiles - 1)) / ntiles;
    }
    else {
      local_4c = 0;
    }
    first = _TIFFMultiply32(tif,local_44,local_4c,"TIFFNumberOfTiles");
    if ((tif->tif_dir).td_imagedepth < -(local_24 - 1) - 1) {
      local_54 = ((tif->tif_dir).td_imagedepth + (local_24 - 1)) / local_24;
    }
    else {
      local_54 = 0;
    }
    local_2c = _TIFFMultiply32(tif,first,local_54,"TIFFNumberOfTiles");
  }
  local_28 = local_2c;
  if ((tif->tif_dir).td_planarconfig == 2) {
    local_28 = _TIFFMultiply32(tif,local_2c,(uint)(tif->tif_dir).td_samplesperpixel,
                               "TIFFNumberOfTiles");
  }
  return local_28;
}

Assistant:

uint32_t TIFFNumberOfTiles(TIFF *tif)
{
    TIFFDirectory *td = &tif->tif_dir;
    uint32_t dx = td->td_tilewidth;
    uint32_t dy = td->td_tilelength;
    uint32_t dz = td->td_tiledepth;
    uint32_t ntiles;

    if (dx == (uint32_t)-1)
        dx = td->td_imagewidth;
    if (dy == (uint32_t)-1)
        dy = td->td_imagelength;
    if (dz == (uint32_t)-1)
        dz = td->td_imagedepth;
    ntiles =
        (dx == 0 || dy == 0 || dz == 0)
            ? 0
            : _TIFFMultiply32(
                  tif,
                  _TIFFMultiply32(tif, TIFFhowmany_32(td->td_imagewidth, dx),
                                  TIFFhowmany_32(td->td_imagelength, dy),
                                  "TIFFNumberOfTiles"),
                  TIFFhowmany_32(td->td_imagedepth, dz), "TIFFNumberOfTiles");
    if (td->td_planarconfig == PLANARCONFIG_SEPARATE)
        ntiles = _TIFFMultiply32(tif, ntiles, td->td_samplesperpixel,
                                 "TIFFNumberOfTiles");
    return (ntiles);
}